

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O0

int GmfGetFloatPrecision(int64_t MshIdx)

{
  int64_t iVar1;
  int64_t in_RDI;
  GmfMshSct *msh;
  int FltSiz;
  int in_stack_fffffffffffffff4;
  int64_t MshIdx_00;
  
  MshIdx_00 = in_RDI;
  iVar1 = GmfStatKwd(in_RDI,0x9b);
  if (iVar1 != 0) {
    GmfGotoKwd(MshIdx_00,in_stack_fffffffffffffff4);
    GmfGetLin(MshIdx_00,0x9b,&stack0xfffffffffffffff4);
    if ((in_stack_fffffffffffffff4 == 0x20) || (in_stack_fffffffffffffff4 == 0x40)) {
      *(int *)(in_RDI + 0x18) = in_stack_fffffffffffffff4;
    }
  }
  return *(int *)(in_RDI + 0x18);
}

Assistant:

int GmfGetFloatPrecision(int64_t MshIdx)
{
   int FltSiz;
   GmfMshSct *msh = (GmfMshSct *)MshIdx;

   if(GmfStatKwd(MshIdx, GmfFloatingPointPrecision))
   {
      GmfGotoKwd(MshIdx, GmfFloatingPointPrecision);
      GmfGetLin(MshIdx, GmfFloatingPointPrecision, &FltSiz);

      if(FltSiz == 32 || FltSiz == 64)
         msh->FltSiz = FltSiz;
   }

   return(msh->FltSiz);
}